

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  pointer pcVar1;
  
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  std::ios_base::~ios_base((ios_base *)&this->field_0xe8);
  pcVar1 = (this->m_info).message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).message.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).macroName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).macroName.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

MessageBuilder( std::string const& macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type )
        : m_info( macroName, lineInfo, type )
        {}